

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QStringList * __thiscall
QLocale::uiLanguages(QStringList *__return_storage_ptr__,QLocale *this,TagSeparator separator)

{
  undefined2 uVar4;
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  QLocaleData *pQVar5;
  Data *pDVar6;
  QArrayDataPointer<QString> *pQVar7;
  QString *pQVar8;
  QLocaleId *this_00;
  QLocaleData *pQVar9;
  undefined6 uVar10;
  QStringView haystack;
  QChar ch;
  ushort uVar11;
  ushort uVar12;
  undefined8 uVar13;
  bool bVar14;
  bool bVar15;
  QLocaleId QVar16;
  QLocaleId QVar17;
  storage_type_conflict *psVar18;
  const_iterator cVar19;
  QtPrivate *this_01;
  QString *pQVar20;
  QSystemLocale *pQVar21;
  storage_type *psVar22;
  storage_type_conflict *psVar23;
  storage_type_conflict *extraout_RDX;
  storage_type_conflict *extraout_RDX_03;
  storage_type_conflict *extraout_RDX_04;
  storage_type_conflict *extraout_RDX_05;
  storage_type_conflict *extraout_RDX_06;
  storage_type_conflict *extraout_RDX_07;
  storage_type_conflict *extraout_RDX_08;
  storage_type_conflict *extraout_RDX_09;
  storage_type_conflict *extraout_RDX_10;
  storage_type_conflict *extraout_RDX_12;
  storage_type_conflict *extraout_RDX_14;
  storage_type_conflict *extraout_RDX_15;
  storage_type_conflict *extraout_RDX_16;
  storage_type_conflict *extraout_RDX_17;
  storage_type_conflict *extraout_RDX_18;
  storage_type_conflict *extraout_RDX_19;
  storage_type_conflict *extraout_RDX_20;
  storage_type_conflict *psVar24;
  undefined8 uVar25;
  storage_type_conflict *psVar26;
  long lVar27;
  qsizetype qVar28;
  _func_int **in_R8;
  undefined8 in_R9;
  long lVar29;
  long lVar30;
  ushort uVar31;
  long *plVar32;
  const_iterator __it;
  ushort uVar33;
  storage_type_conflict *i;
  const_iterator cVar34;
  long in_FS_OFFSET;
  bool bVar35;
  QStringView name;
  QStringView name_00;
  QStringView name_01;
  QStringView haystack_00;
  QStringView name_02;
  QStringView haystack_01;
  QStringView before;
  QStringView name_03;
  QStringView str;
  QLatin1StringView str_00;
  QByteArrayView ba;
  QLatin1StringView rhs;
  QStringView needle;
  QStringView needle_00;
  QStringView needle_01;
  QStringView needle_02;
  QStringView rhs_00;
  QByteArrayView ba_00;
  QStringView str_01;
  QByteArrayView ba_01;
  pair<std::__detail::_Node_iterator<QString,_true,_true>,_bool> pVar36;
  QStringView lhs;
  QStringView haystack_02;
  QStringView haystack_03;
  QLatin1StringView haystack_04;
  QStringView lhs_00;
  QStringView after;
  add_const_t<QList<QString>_> *__range2;
  QLocaleId id;
  QDuplicateTracker<QString,_32UL> known;
  long local_7c0;
  QLocaleId *local_7a0;
  long local_788;
  QLocaleId local_758;
  QLocaleId local_750;
  QArrayDataPointer<QString> local_748;
  QList<QLocaleId> local_728;
  QArrayDataPointer<QString> local_708;
  undefined1 local_6e8 [22];
  TagSeparator TStack_6d2;
  undefined1 uStack_6d1;
  QArrayDataPointer<QString> *pQStack_6d0;
  QString *local_6c8;
  QLocaleId *pQStack_6c0;
  bool local_6b8;
  undefined7 uStack_6b7;
  monotonic_buffer_resource local_e8 [64];
  undefined1 local_a8 [80];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 local_40;
  long local_38;
  storage_type_conflict *extraout_RDX_00;
  storage_type_conflict *extraout_RDX_01;
  storage_type_conflict *extraout_RDX_02;
  storage_type_conflict *extraout_RDX_11;
  storage_type_conflict *extraout_RDX_13;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if ((char)separator < '\0') {
    badSeparatorWarning("uiLanguages",separator);
    goto LAB_00315211;
  }
  local_728.d.d = (Data *)0x0;
  local_728.d.ptr = (QLocaleId *)0x0;
  local_728.d.size = 0;
  pQVar5 = ((this->d).d.ptr)->m_data;
  if (pQVar5 == &systemLocaleData) {
    pQVar21 = systemLocale();
    local_58 = (QArrayDataPointer<QString> *)0x0;
    uStack_50 = (QString *)0x0;
    uStack_48 = (QLocaleId *)0x0;
    local_40 = 2;
    in_R8 = pQVar21->_vptr_QSystemLocale;
    (*in_R8[2])(local_6e8,pQVar21,0x22);
    ::QVariant::toStringList((QStringList *)&local_748,(QVariant *)local_6e8);
    qVar28 = local_748.size;
    pQVar20 = local_748.ptr;
    pDVar6 = local_748.d;
    local_748.size = 0;
    local_748.d = (Data *)0x0;
    local_748.ptr = (QString *)0x0;
    local_708.d = (__return_storage_ptr__->d).d;
    local_708.ptr = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = pDVar6;
    (__return_storage_ptr__->d).ptr = pQVar20;
    local_708.size = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = qVar28;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_708);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_748);
    ::QVariant::~QVariant((QVariant *)local_6e8);
    ::QVariant::~QVariant((QVariant *)&local_58);
    uVar25 = local_6e8._0_8_;
    psVar23 = extraout_RDX_18;
    if (separator != Dash) {
      in_R8 = (_func_int **)local_6e8;
      local_6e8[1] = 0;
      local_6e8[0] = separator;
      local_6e8._2_6_ = SUB86(uVar25,2);
      in_R9 = 1;
      before.m_data = L"-";
      before.m_size = 1;
      after.m_data = (storage_type_conflict *)in_R8;
      after.m_size = 1;
      QtPrivate::QStringList_replaceInStrings(__return_storage_ptr__,before,after,CaseSensitive);
      QArrayDataPointer<QString>::operator=(&__return_storage_ptr__->d,&__return_storage_ptr__->d);
      psVar23 = extraout_RDX_19;
    }
    lVar29 = (__return_storage_ptr__->d).size;
    if (lVar29 != 0) {
      pQVar20 = (__return_storage_ptr__->d).ptr;
      lVar27 = 0;
      do {
        name_03.m_data = psVar23;
        name_03.m_size = *(qsizetype *)((long)&(pQVar20->d).ptr + lVar27);
        QVar16 = QLocaleId::fromName(*(QLocaleId **)((long)&(pQVar20->d).size + lVar27),name_03);
        local_6e8._0_6_ = QVar16;
        QtPrivate::QPodArrayOps<QLocaleId>::emplace<QLocaleId>
                  ((QPodArrayOps<QLocaleId> *)&local_728,local_728.d.size,(QLocaleId *)local_6e8);
        QList<QLocaleId>::end(&local_728);
        lVar27 = lVar27 + 0x18;
        psVar23 = extraout_RDX_20;
      } while (lVar29 * 0x18 != lVar27);
    }
    if ((QArrayDataPointer<QString> *)local_728.d.size == (QArrayDataPointer<QString> *)0x0) {
      pQVar21 = systemLocale();
      (*pQVar21->_vptr_QSystemLocale[3])(local_6e8,pQVar21);
      if ((((PrivateShared *)(local_6e8._0_8_ + 8))->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 1) {
        QSharedDataPointer<QLocalePrivate>::detach_helper
                  ((QSharedDataPointer<QLocalePrivate> *)local_6e8);
      }
      iVar2 = *(int *)((long)*(PrivateShared *)local_6e8._0_8_ + 2);
      local_58._4_2_ = (short)((uint)iVar2 >> 0x10);
      local_58._0_4_ = iVar2 << 0x10 | (uint)*(ushort *)*(PrivateShared *)local_6e8._0_8_;
      QtPrivate::QPodArrayOps<QLocaleId>::emplace<QLocaleId>
                ((QPodArrayOps<QLocaleId> *)&local_728,local_728.d.size,(QLocaleId *)&local_58);
      QList<QLocaleId>::end(&local_728);
      ~QLocale((QLocale *)local_6e8);
    }
    stack0xfffffffffffff928 = &DAT_aaaaaaaaaaaaaaaa;
    local_6e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_6e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar9 = ((this->d).d.ptr)->m_data;
    psVar22 = (storage_type *)(ulong)pQVar9->m_language_id;
    iVar2._0_2_ = pQVar9->m_script_id;
    iVar2._2_2_ = pQVar9->m_territory_id;
    local_708.d = (Data *)CONCAT44(CONCAT22(local_708.d._6_2_,iVar2._2_2_),
                                   iVar2 << 0x10 | (uint)pQVar9->m_language_id);
    QLocaleId::name((QByteArray *)&local_58,(QLocaleId *)&local_708,separator);
    ba_00.m_data = psVar22;
    ba_00.m_size = uStack_50;
    QString::fromLatin1((QString *)local_6e8,(QString *)uStack_48,ba_00);
    if ((QArrayDataPointer<QString> *)local_58 != (QArrayDataPointer<QString> *)0x0) {
      LOCK();
      (((PrivateShared *)local_58)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (((PrivateShared *)local_58)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((PrivateShared *)local_58)->ref).super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_58,1,0x10);
      }
    }
    if ((((QStringList *)stack0xfffffffffffff928 != (QStringList *)0x0) &&
        (((this->d).d.ptr)->m_data->m_language_id != 1)) &&
       (str_01.m_data = (storage_type_conflict *)0x1, str_01.m_size = local_6e8._8_8_,
       bVar14 = QtPrivate::QStringList_contains
                          ((QtPrivate *)__return_storage_ptr__,
                           (QStringList *)stack0xfffffffffffff928,str_01,(CaseSensitivity)in_R8),
       !bVar14)) {
      pQVar9 = ((this->d).d.ptr)->m_data;
      iVar3._0_2_ = pQVar9->m_script_id;
      iVar3._2_2_ = pQVar9->m_territory_id;
      local_748.d = (Data *)CONCAT44(CONCAT22((short)((ulong)local_748.d >> 0x30),iVar3._2_2_),
                                     iVar3 << 0x10 | (uint)pQVar9->m_language_id);
      QVar16 = QLocaleId::withLikelySubtagsRemoved((QLocaleId *)&local_748);
      __it.i = (__return_storage_ptr__->d).ptr;
      psVar22 = (storage_type *)(__return_storage_ptr__->d).size;
      pQVar20 = __it.i + (long)psVar22;
      local_58._0_6_ = QVar16;
      if (0 < (long)psVar22 >> 2) {
        lVar27 = ((long)psVar22 >> 2) + 1;
        lVar29 = (long)psVar22 * 0x18;
        psVar22 = (storage_type *)((long)psVar22 * 8);
        do {
          bVar14 = __gnu_cxx::__ops::
                   _Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>::operator()
                             ((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              ((anon_union_24_3_e3d07ef4_for_data *)&local_58)->data,__it);
          cVar34.i = __it.i;
          if (bVar14) goto LAB_00315675;
          bVar14 = __gnu_cxx::__ops::
                   _Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>::operator()
                             ((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              ((anon_union_24_3_e3d07ef4_for_data *)&local_58)->data,__it.i + 1);
          cVar34.i = __it.i + 1;
          if (bVar14) goto LAB_00315675;
          bVar14 = __gnu_cxx::__ops::
                   _Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>::operator()
                             ((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              ((anon_union_24_3_e3d07ef4_for_data *)&local_58)->data,__it.i + 2);
          cVar34.i = __it.i + 2;
          if (bVar14) goto LAB_00315675;
          bVar14 = __gnu_cxx::__ops::
                   _Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>::operator()
                             ((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              ((anon_union_24_3_e3d07ef4_for_data *)&local_58)->data,__it.i + 3);
          cVar34.i = __it.i + 3;
          if (bVar14) goto LAB_00315675;
          __it.i = __it.i + 4;
          lVar27 = lVar27 + -1;
          lVar29 = lVar29 + -0x60;
        } while (1 < lVar27);
        psVar22 = (storage_type *)((lVar29 >> 3) * -0x5555555555555555);
      }
      if (psVar22 == (storage_type *)0x1) {
LAB_0031565c:
        bVar14 = __gnu_cxx::__ops::_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>
                 ::operator()((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              ((anon_union_24_3_e3d07ef4_for_data *)&local_58)->data,__it);
        cVar34.i = __it.i;
        if (!bVar14) {
          cVar34.i = pQVar20;
        }
LAB_00315675:
        if (cVar34.i != pQVar20) goto LAB_0031573b;
      }
      else {
        if (psVar22 == (storage_type *)0x2) {
LAB_00315644:
          bVar14 = __gnu_cxx::__ops::
                   _Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>::operator()
                             ((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              ((anon_union_24_3_e3d07ef4_for_data *)&local_58)->data,__it);
          cVar34.i = __it.i;
          if (!bVar14) {
            __it.i = __it.i + 1;
            goto LAB_0031565c;
          }
          goto LAB_00315675;
        }
        if (psVar22 == (storage_type *)0x3) {
          bVar14 = __gnu_cxx::__ops::
                   _Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::$_1>::operator()
                             ((_Iter_pred<QLocale::uiLanguages(QLocale::TagSeparator)const::__1> *)
                              ((anon_union_24_3_e3d07ef4_for_data *)&local_58)->data,__it);
          cVar34.i = __it.i;
          if (!bVar14) {
            __it.i = __it.i + 1;
            goto LAB_00315644;
          }
          goto LAB_00315675;
        }
      }
      QtPrivate::QPodArrayOps<QLocaleId>::emplace<QLocaleId_const&>
                ((QPodArrayOps<QLocaleId> *)&local_728,0,(QLocaleId *)&local_748);
      QLocaleId::name((QByteArray *)&local_708,(QLocaleId *)&local_748,separator);
      ba_01.m_data = psVar22;
      ba_01.m_size = (qsizetype)local_708.ptr;
      QString::fromLatin1((QString *)&local_58,(QString *)local_708.size,ba_01);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)__return_storage_ptr__,0,(QString *)&local_58);
      if ((QArrayDataPointer<QString> *)local_58 != (QArrayDataPointer<QString> *)0x0) {
        LOCK();
        (((PrivateShared *)local_58)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             (((PrivateShared *)local_58)->ref).super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((PrivateShared *)local_58)->ref).super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_58,2,0x10);
        }
      }
      if ((QArrayDataPointer<QString> *)local_708.d != (QArrayDataPointer<QString> *)0x0) {
        LOCK();
        *(int *)&(local_708.d)->super_QArrayData = *(int *)&(local_708.d)->super_QArrayData + -1;
        UNLOCK();
        if (*(int *)&(local_708.d)->super_QArrayData == 0) {
          QArrayData::deallocate(&(local_708.d)->super_QArrayData,1,0x10);
        }
      }
    }
LAB_0031573b:
    if ((QArrayDataPointer<QString> *)local_6e8._0_8_ != (QArrayDataPointer<QString> *)0x0) {
      LOCK();
      (((QAtomicInt *)local_6e8._0_8_)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (((QAtomicInt *)local_6e8._0_8_)->super_QAtomicInteger<int>).
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QAtomicInt *)local_6e8._0_8_)->super_QAtomicInteger<int>).
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_6e8._0_8_,2,0x10);
      }
    }
  }
  else {
    uVar4 = pQVar5->m_territory_id;
    uVar10._0_2_ = pQVar5->m_language_id;
    uVar10._2_2_ = pQVar5->m_script_id;
    uVar10._4_2_ = pQVar5->m_territory_id;
    local_6e8._4_2_ = uVar4;
    local_6e8._0_4_ = (int)uVar10;
    QtPrivate::QPodArrayOps<QLocaleId>::emplace<QLocaleId>
              ((QPodArrayOps<QLocaleId> *)&local_728,0,(QLocaleId *)local_6e8);
    QList<QLocaleId>::end(&local_728);
  }
  if ((QArrayDataPointer<QString> *)local_728.d.size != (QArrayDataPointer<QString> *)0x0) {
    lVar29 = local_728.d.size * 6;
    pQVar7 = (QArrayDataPointer<QString> *)local_728.d.size;
    do {
      uVar1 = *(undefined4 *)((long)&local_728.d.ptr[-1].language_id + lVar29);
      local_748.d._0_6_ = CONCAT24(*(undefined2 *)((long)local_728.d.ptr + lVar29 + -2),uVar1);
      if ((short)uVar1 == 1) {
        str.m_data = (storage_type_conflict *)0x1;
        str.m_size = (qsizetype)L"C";
        bVar14 = QtPrivate::QStringList_contains
                           ((QtPrivate *)__return_storage_ptr__,(QStringList *)0x1,str,
                            (CaseSensitivity)in_R8);
        if (!bVar14) {
          local_6e8._0_8_ = (QArrayDataPointer<QString> *)0x0;
          local_6e8._8_8_ = L"C";
          stack0xfffffffffffff928 = (QStringList *)0x1;
          QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                    ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                     (__return_storage_ptr__->d).size,(QString *)local_6e8);
          QList<QString>::end(__return_storage_ptr__);
          if ((QArrayDataPointer<QString> *)local_6e8._0_8_ != (QArrayDataPointer<QString> *)0x0) {
            LOCK();
            (((QAtomicInt *)local_6e8._0_8_)->super_QAtomicInteger<int>).
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                 (((QAtomicInt *)local_6e8._0_8_)->super_QAtomicInteger<int>).
                 super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QAtomicInt *)local_6e8._0_8_)->super_QAtomicInteger<int>).
                super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 0)
            goto LAB_003148c0;
            qVar28 = 2;
            uVar25 = local_6e8._0_8_;
LAB_003148b6:
            QArrayData::deallocate((QArrayData *)uVar25,qVar28,0x10);
          }
        }
      }
      else {
        local_708.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        uStack_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        QLocaleId::name((QByteArray *)&local_58,(QLocaleId *)&local_748,separator);
        uVar25 = uStack_50;
        if ((pQVar5 == &systemLocaleData) &&
           (pQVar7 <= (QArrayDataPointer<QString> *)(__return_storage_ptr__->d).size)) {
          pQVar20 = (__return_storage_ptr__->d).ptr;
          local_7a0 = (QLocaleId *)uStack_48;
          if (*(QLocaleId **)((long)pQVar20 + lVar29 * 4 + -8) == (QLocaleId *)uStack_48) {
            rhs.m_data = (char *)uStack_50;
            rhs.m_size = uStack_48;
            lhs.m_data = *(storage_type_conflict **)((long)pQVar20 + lVar29 * 4 + -0x10);
            lhs.m_size = uStack_48;
            bVar14 = QtPrivate::equalStrings(lhs,rhs);
            local_708.d = (Data *)pQVar7;
          }
          else {
            bVar14 = false;
            local_708.d = (Data *)pQVar7;
          }
        }
        else {
          str_00.m_data = (char *)0x1;
          str_00.m_size = uStack_50;
          psVar22 = (storage_type *)0x1;
          bVar14 = QtPrivate::QStringList_contains
                             ((QtPrivate *)__return_storage_ptr__,(QStringList *)uStack_48,str_00,
                              (CaseSensitivity)in_R8);
          if (!bVar14) {
            ba.m_data = psVar22;
            ba.m_size = uStack_50;
            QString::fromLatin1((QString *)local_6e8,(QString *)uStack_48,ba);
            QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                      ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                       (__return_storage_ptr__->d).size,(QString *)local_6e8);
            QList<QString>::end(__return_storage_ptr__);
            uVar25 = local_6e8._0_8_;
            if ((QArrayDataPointer<QString> *)local_6e8._0_8_ != (QArrayDataPointer<QString> *)0x0)
            {
              LOCK();
              (((QAtomicInt *)local_6e8._0_8_)->super_QAtomicInteger<int>).
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   (((QAtomicInt *)local_6e8._0_8_)->super_QAtomicInteger<int>).
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((QAtomicInt *)uVar25)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>
                  ._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_6e8._0_8_,2,0x10);
              }
            }
          }
          local_7a0 = (QLocaleId *)uStack_48;
          bVar14 = true;
          local_708.d = (Data *)(__return_storage_ptr__->d).size;
          uVar25 = uStack_50;
        }
        QVar16 = QLocaleId::withLikelySubtagsAdded((QLocaleId *)&local_748);
        local_6e8._0_8_ = &local_708;
        uVar33 = QVar16.script_id;
        uVar31 = QVar16.territory_id;
        TStack_6d2 = separator;
        local_6e8._16_6_ = QVar16;
        uStack_6d1 = 0xaa;
        pQStack_6d0 = (QArrayDataPointer<QString> *)local_58;
        pQStack_6c0 = local_7a0;
        if ((QArrayDataPointer<QString> *)local_58 != (QArrayDataPointer<QString> *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&((PrivateShared *)local_58)->ref)->_q_value).
          super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&((PrivateShared *)local_58)->ref)->_q_value).
               super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        uStack_6b7 = 0xaaaaaaaaaaaaaa;
        local_6b8 = bVar14;
        local_6e8._8_8_ = __return_storage_ptr__;
        local_6c8 = (QString *)uVar25;
        uiLanguages::anon_class_56_6_d83b7451::operator()
                  ((anon_class_56_6_d83b7451 *)local_6e8,(QLocaleId)((uint6)QVar16 & 0xffff));
        if (uVar33 != 0) {
          uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)local_6e8,(QLocaleId)((uint6)QVar16 & 0xffffffff));
        }
        uVar11 = local_748.d._2_2_;
        if (local_748.d._2_2_ != uVar33 && local_748.d._2_2_ != 0) {
          QVar17.territory_id = 0;
          QVar17.language_id = (short)(uint)local_748.d;
          QVar17.script_id = (short)((uint)local_748.d >> 0x10);
          uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)local_6e8,QVar17);
        }
        if (uVar31 != 0) {
          uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)local_6e8,
                     (QLocaleId)((uint6)QVar16 & 0xffff0000ffff));
        }
        uVar12 = local_748.d._4_2_;
        if (local_748.d._4_2_ != uVar31 && local_748.d._4_2_ != 0) {
          uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)local_6e8,
                     (QLocaleId)((uint6)local_748.d._4_2_ << 0x20 | (uint6)(ushort)local_748.d));
        }
        if (uVar33 != 0 && uVar31 != 0) {
          uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)local_6e8,QVar16);
        }
        if ((uVar11 != 0 && uVar31 != 0) && uVar11 != uVar33) {
          uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)local_6e8,
                     (QLocaleId)
                     ((uint6)uVar11 << 0x10 |
                     (uint6)QVar16 & 0xffff00000000 | (uint6)(ushort)local_748.d));
        }
        if ((uVar12 == 0 || uVar33 == 0) || uVar12 == uVar31) {
          if (uVar12 != 0) goto LAB_0031482a;
        }
        else {
          uiLanguages::anon_class_56_6_d83b7451::operator()
                    ((anon_class_56_6_d83b7451 *)local_6e8,
                     (QLocaleId)
                     (CONCAT24(uVar12,QVar16._0_4_) & 0xffffffff0000 | (uint6)(ushort)local_748.d));
LAB_0031482a:
          if ((uVar11 != uVar33 && uVar11 != 0) && uVar12 != uVar31) {
            uiLanguages::anon_class_56_6_d83b7451::operator()
                      ((anon_class_56_6_d83b7451 *)local_6e8,
                       (QLocaleId)((uint6)local_748.d._4_4_ << 0x20 | (uint6)(uint)local_748.d));
          }
        }
        if (pQStack_6d0 != (QArrayDataPointer<QString> *)0x0) {
          LOCK();
          *(int *)&pQStack_6d0->d = *(int *)&pQStack_6d0->d + -1;
          UNLOCK();
          if (*(int *)&pQStack_6d0->d == 0) {
            QArrayData::deallocate((QArrayData *)pQStack_6d0,1,0x10);
          }
        }
        if ((QArrayDataPointer<QString> *)local_58 != (QArrayDataPointer<QString> *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&((PrivateShared *)local_58)->ref)->_q_value).
          super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&((PrivateShared *)local_58)->ref)->_q_value).
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&((PrivateShared *)local_58)->ref)->_q_value).
              super___atomic_base<int>._M_i == 0) {
            qVar28 = 1;
            uVar25 = local_58;
            goto LAB_003148b6;
          }
        }
      }
LAB_003148c0:
      lVar29 = lVar29 + -6;
      bVar14 = (QArrayDataPointer<QString> *)0x1 < pQVar7;
      pQVar7 = (QArrayDataPointer<QString> *)((long)&pQVar7[-1].size + 7);
    } while (bVar14);
  }
  memcpy((QDuplicateTracker<QString,_32UL> *)local_6e8,&DAT_004e32a0,0x688);
  QDuplicateTracker<QString,_32UL>::QDuplicateTracker
            ((QDuplicateTracker<QString,_32UL> *)local_6e8,(__return_storage_ptr__->d).size);
  if ((__return_storage_ptr__->d).size != 0) {
    lVar29 = 0;
    do {
      local_58 = local_a8 + 8;
      pVar36 = std::
               _Hashtable<QString,QString,std::pmr::polymorphic_allocator<QString>,std::__detail::_Identity,std::equal_to<QString>,QDuplicateTracker<QString,32ul>::QHasher<QString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::
               _M_insert<QString_const&,std::__detail::_AllocNode<std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,true>>>>
                         ((_Hashtable<QString,QString,std::pmr::polymorphic_allocator<QString>,std::__detail::_Identity,std::equal_to<QString>,QDuplicateTracker<QString,32ul>::QHasher<QString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)local_a8,(__return_storage_ptr__->d).ptr + lVar29,
                          (anon_union_24_3_e3d07ef4_for_data *)&local_58);
      psVar23 = pVar36._8_8_;
      if (((undefined1  [16])pVar36 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pDVar6 = (__return_storage_ptr__->d).d;
        if ((pDVar6 == (Data *)0x0) ||
           (1 < (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QArrayDataPointer<QString>::reallocateAndGrow
                    (&__return_storage_ptr__->d,GrowsAtEnd,0,(QArrayDataPointer<QString> *)0x0);
        }
        QtPrivate::QMovableArrayOps<QString>::erase
                  ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).ptr + lVar29,1);
        psVar23 = extraout_RDX;
      }
      else {
        lVar29 = lVar29 + 1;
      }
      lVar27 = (__return_storage_ptr__->d).size;
    } while (lVar29 < lVar27);
    if (lVar27 != 0) {
      psVar18 = (storage_type_conflict *)0x0;
      i = (storage_type_conflict *)0x0;
      psVar24 = (storage_type_conflict *)0x0;
      do {
        ch.ucs._1_1_ = 0;
        ch.ucs._0_1_ = separator;
        pQVar20 = (__return_storage_ptr__->d).ptr;
        pQVar7 = (QArrayDataPointer<QString> *)pQVar20[(long)psVar24].d.d;
        pQVar8 = (QString *)pQVar20[(long)psVar24].d.ptr;
        this_00 = (QLocaleId *)pQVar20[(long)psVar24].d.size;
        if (pQVar7 != (QArrayDataPointer<QString> *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        name.m_data = psVar23;
        name.m_size = (qsizetype)pQVar8;
        QVar16 = QLocaleId::fromName(this_00,name);
        local_58._0_6_ = QVar16;
        QVar16 = QLocaleId::withLikelySubtagsAdded((QLocaleId *)&local_58);
        if ((long)psVar18 <= (long)psVar24) {
          lVar29 = (long)psVar24 * 0x18 + 0x28;
          psVar23 = psVar18;
          psVar18 = psVar24;
          while (psVar18 = (storage_type_conflict *)((long)psVar18 + 1), i = psVar18,
                (long)psVar18 < (__return_storage_ptr__->d).size) {
            pQVar20 = (__return_storage_ptr__->d).ptr;
            name_00.m_data = psVar23;
            name_00.m_size = *(qsizetype *)((long)pQVar20 + lVar29 + -8);
            QVar17 = QLocaleId::fromName(*(QLocaleId **)((long)&(pQVar20->d).d + lVar29),name_00);
            local_58._0_6_ = QVar17;
            QVar17 = QLocaleId::withLikelySubtagsAdded((QLocaleId *)&local_58);
            if (((QVar17.language_id != QVar16.language_id) ||
                (((QVar17._0_4_ ^ QVar16._0_4_) & 0xffff0000) != 0)) ||
               (lVar29 = lVar29 + 0x18, psVar23 = psVar18,
               QVar17.territory_id != QVar16.territory_id)) break;
          }
        }
        if (pQVar7 != (QArrayDataPointer<QString> *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        haystack.m_data = (storage_type_conflict *)pQVar8;
        haystack.m_size = (qsizetype)this_00;
        needle.m_data = L"C";
        needle.m_size = 1;
        bVar14 = QtPrivate::startsWith(haystack,needle,CaseSensitive);
        if ((bVar14) &&
           ((this_00 == (QLocaleId *)0x1 ||
            (*(storage_type_conflict *)((long)&(pQVar8->d).d + 2) == ch.ucs)))) {
          bVar14 = true;
          psVar23 = extraout_RDX_00;
          if (pQVar7 != (QArrayDataPointer<QString> *)0x0) {
LAB_00314c11:
            LOCK();
            (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)pQVar7,2,0x10);
              psVar23 = extraout_RDX_04;
            }
            if (!bVar14) goto LAB_00314c46;
            goto LAB_0031518f;
          }
        }
        else {
          if (pQVar7 != (QArrayDataPointer<QString> *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
            needle_00.m_data = L"und";
            needle_00.m_size = 3;
            haystack_02.m_data = (storage_type_conflict *)pQVar8;
            haystack_02.m_size = (qsizetype)this_00;
            bVar14 = QtPrivate::startsWith(haystack_02,needle_00,CaseSensitive);
            psVar23 = extraout_RDX_01;
            if (bVar14) {
LAB_00314bdc:
              bVar14 = true;
              if (this_00 != (QLocaleId *)0x3) {
                bVar14 = *(storage_type_conflict *)((long)&(pQVar8->d).d + 6) == ch.ucs;
              }
              if (pQVar7 == (QArrayDataPointer<QString> *)0x0) {
                if (bVar14) goto LAB_003151a3;
                goto LAB_00314c46;
              }
            }
            else {
              bVar14 = false;
            }
            LOCK();
            (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)pQVar7,2,0x10);
              psVar23 = extraout_RDX_03;
            }
            goto LAB_00314c11;
          }
          needle_01.m_data = L"und";
          needle_01.m_size = 3;
          haystack_03.m_data = (storage_type_conflict *)pQVar8;
          haystack_03.m_size = (qsizetype)this_00;
          bVar14 = QtPrivate::startsWith(haystack_03,needle_01,CaseSensitive);
          psVar23 = extraout_RDX_02;
          if (bVar14) goto LAB_00314bdc;
LAB_00314c46:
          local_7c0 = (__return_storage_ptr__->d).size;
          if (pQVar7 != (QArrayDataPointer<QString> *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_788 = (long)i * 0x18 + 0x28;
          local_58 = pQVar7;
          uStack_50 = pQVar8;
          uStack_48 = this_00;
          while( true ) {
            qVar28 = QString::lastIndexOf((QString *)&local_58,ch,-1,CaseSensitive);
            psVar23 = extraout_RDX_05;
            if (qVar28 < 1) break;
            QString::QString((QString *)&local_708,(QChar *)uStack_50,qVar28);
            uVar13 = uStack_50;
            uVar25 = local_58;
            qVar28 = local_708.size;
            pDVar6 = local_708.d;
            local_708.d = (Data *)local_58;
            local_58 = pDVar6;
            uStack_50 = local_708.ptr;
            local_708.ptr = (QString *)uVar13;
            local_708.size = uStack_48;
            uStack_48 = qVar28;
            if ((QArrayDataPointer<QString> *)uVar25 != (QArrayDataPointer<QString> *)0x0) {
              LOCK();
              (((PrivateShared *)uVar25)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
                   (((PrivateShared *)uVar25)->ref).super_QAtomicInteger<int>.
                   super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((PrivateShared *)uVar25)->ref).super_QAtomicInteger<int>.
                  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate((QArrayData *)uVar25,2,0x10);
              }
            }
            cVar19 = std::
                     _Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find((_Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)local_a8,(key_type *)&local_58);
            name_01.m_data = extraout_RDX_06;
            name_01.m_size = uStack_50;
            QVar17 = QLocaleId::fromName((QLocaleId *)uStack_48,name_01);
            local_708.d = (Data *)CONCAT26(local_708.d._6_2_,QVar17);
            QVar17 = QLocaleId::withLikelySubtagsAdded((QLocaleId *)&local_708);
            bVar14 = ((QVar17._0_4_ ^ QVar16._0_4_) & 0xffff0000) == 0;
            bVar35 = cVar19.super__Node_iterator_base<QString,_true>._M_cur != (__node_type *)0x0;
            psVar23 = extraout_RDX_07;
            if ((!bVar35) && ((long)i < local_7c0)) {
              bVar35 = false;
              lVar29 = local_788;
              psVar26 = i;
              do {
                pQVar20 = (__return_storage_ptr__->d).ptr;
                local_708.d = (Data *)pQVar20[(long)psVar26].d.d;
                local_708.ptr = (QString *)pQVar20[(long)psVar26].d.ptr;
                local_708.size = pQVar20[(long)psVar26].d.size;
                if ((QArrayDataPointer<QString> *)local_708.d != (QArrayDataPointer<QString> *)0x0)
                {
                  LOCK();
                  *(int *)&((QArrayDataPointer<QString> *)local_708.d)->d =
                       *(int *)&((QArrayDataPointer<QString> *)local_708.d)->d + 1;
                  UNLOCK();
                }
                bVar15 = QString::startsWith((QString *)&local_708,(QString *)&local_58,
                                             CaseSensitive);
                uVar25 = uStack_48;
                pQVar20 = local_708.ptr;
                if (bVar15) {
                  psVar23 = extraout_RDX_08;
                  if (*(storage_type_conflict *)((long)&((local_708.ptr)->d).d + uStack_48 * 2) ==
                      ch.ucs) {
                    haystack_00.m_data = (storage_type_conflict *)0xffffffffffffffff;
                    haystack_00.m_size = (qsizetype)local_708.ptr;
                    this_01 = (QtPrivate *)
                              QtPrivate::lastIndexOf
                                        ((QtPrivate *)local_708.size,haystack_00,
                                         (ulong)(uint)separator,L'\x01',(CaseSensitivity)in_R9);
                    psVar23 = extraout_RDX_09;
                    if ((long)uVar25 < (long)this_01 && !bVar35) {
                      lVar27 = (__return_storage_ptr__->d).size;
                      pQVar8 = (__return_storage_ptr__->d).ptr;
                      while (lVar30 = (long)psVar26 + 1,
                            plVar32 = (long *)((long)&(pQVar8->d).d + lVar29),
                            (long)psVar26 + 1 < lVar27) {
                        while (((QtPrivate *)*plVar32 != this_01 ||
                               (rhs_00.m_data = (storage_type_conflict *)pQVar20,
                               rhs_00.m_size = (qsizetype)this_01,
                               lhs_00.m_data = (storage_type_conflict *)plVar32[-1],
                               lhs_00.m_size = (qsizetype)this_01,
                               bVar14 = QtPrivate::equalStrings(lhs_00,rhs_00),
                               psVar23 = extraout_RDX_13, !bVar14))) {
                          lVar30 = lVar30 + 1;
                          plVar32 = plVar32 + 3;
                          if (lVar27 <= lVar30) goto LAB_00315065;
                        }
                        haystack_01.m_data = (storage_type_conflict *)0xffffffffffffffff;
                        haystack_01.m_size = (qsizetype)pQVar20;
                        this_01 = (QtPrivate *)
                                  QtPrivate::lastIndexOf
                                            (this_01,haystack_01,(ulong)(uint)separator,L'\x01',
                                             (CaseSensitivity)in_R9);
                        psVar23 = extraout_RDX_14;
                        if (((long)this_01 <= (long)uVar25) || (bVar35)) goto LAB_00315073;
                      }
LAB_00315065:
                      bVar35 = true;
LAB_00315073:
                      bVar14 = false;
                    }
                    else {
                      bVar14 = false;
                    }
                  }
                }
                else {
                  local_748.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                  local_748.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                  local_748.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
                  pQVar20 = QString::replace((QString *)&local_708,ch,(QChar)0x2d,CaseSensitive);
                  name_02.m_data = extraout_RDX_10;
                  name_02.m_size = (qsizetype)(pQVar20->d).ptr;
                  QVar17 = QLocaleId::fromName((QLocaleId *)(pQVar20->d).size,name_02);
                  local_758._0_4_ = QVar17._0_4_;
                  local_758.territory_id = QVar17.territory_id;
                  QVar17 = QLocaleId::withLikelySubtagsAdded(&local_758);
                  local_750._0_4_ = QVar17._0_4_;
                  local_750.territory_id = QVar17.territory_id;
                  QLocaleId::name((QByteArray *)&local_748,&local_750,separator);
                  uVar25 = uStack_48;
                  qVar28 = local_748.size;
                  pQVar20 = local_748.ptr;
                  needle_02.m_data = (storage_type_conflict *)uStack_50;
                  needle_02.m_size = uStack_48;
                  haystack_04.m_data = (char *)local_748.ptr;
                  haystack_04.m_size = local_748.size;
                  bVar15 = QtPrivate::startsWith(haystack_04,needle_02,CaseSensitive);
                  if ((bVar15) &&
                     ((qVar28 == uVar25 ||
                      (*(TagSeparator *)((long)&(pQVar20->d).d + uVar25) == separator)))) {
                    bVar14 = false;
                  }
                  psVar23 = extraout_RDX_11;
                  if (&(local_748.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_748.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_748.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_748.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_748.d)->super_QArrayData,1,0x10);
                      psVar23 = extraout_RDX_12;
                    }
                  }
                }
                if ((QArrayDataPointer<QString> *)local_708.d != (QArrayDataPointer<QString> *)0x0)
                {
                  LOCK();
                  *(int *)&(local_708.d)->super_QArrayData =
                       *(int *)&(local_708.d)->super_QArrayData + -1;
                  UNLOCK();
                  if (*(int *)&(local_708.d)->super_QArrayData == 0) {
                    QArrayData::deallocate(&(local_708.d)->super_QArrayData,2,0x10);
                    psVar23 = extraout_RDX_15;
                  }
                }
                if (bVar35) break;
                psVar26 = (storage_type_conflict *)((long)psVar26 + 1);
                lVar29 = lVar29 + 0x18;
              } while ((long)psVar26 < local_7c0);
            }
            if (bVar35) break;
            local_708.d = (Data *)(local_a8 + 8);
            std::
            _Hashtable<QString,QString,std::pmr::polymorphic_allocator<QString>,std::__detail::_Identity,std::equal_to<QString>,QDuplicateTracker<QString,32ul>::QHasher<QString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<QString_const&,std::__detail::_AllocNode<std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,true>>>>
                      ((_Hashtable<QString,QString,std::pmr::polymorphic_allocator<QString>,std::__detail::_Identity,std::equal_to<QString>,QDuplicateTracker<QString,32ul>::QHasher<QString>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)local_a8,(anon_union_24_3_e3d07ef4_for_data *)&local_58,&local_708);
            if (bVar14) {
              QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                        ((QMovableArrayOps<QString> *)__return_storage_ptr__,(qsizetype)i,
                         (QString *)&local_58);
              QList<QString>::begin(__return_storage_ptr__);
              i = (storage_type_conflict *)((long)i + 1);
              local_7c0 = local_7c0 + 1;
              local_788 = local_788 + 0x18;
            }
            else {
              QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                        ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                         (__return_storage_ptr__->d).size,(QString *)&local_58);
              QList<QString>::end(__return_storage_ptr__);
            }
          }
          uVar25 = local_58;
          if ((QArrayDataPointer<QString> *)local_58 != (QArrayDataPointer<QString> *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)&((PrivateShared *)local_58)->ref)->_q_value).
            super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&((PrivateShared *)local_58)->ref)->_q_value).
                 super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&((PrivateShared *)uVar25)->ref)->_q_value).
                super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)local_58,2,0x10);
              psVar23 = extraout_RDX_16;
            }
          }
          if (pQVar7 != (QArrayDataPointer<QString> *)0x0) {
LAB_0031518f:
            LOCK();
            (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)&pQVar7->d)->_q_value).super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate((QArrayData *)pQVar7,2,0x10);
              psVar23 = extraout_RDX_17;
            }
          }
        }
LAB_003151a3:
        psVar24 = (storage_type_conflict *)((long)psVar24 + 1);
        if ((long)psVar18 <= (long)psVar24) {
          psVar24 = i;
        }
      } while ((long)psVar24 < (__return_storage_ptr__->d).size);
    }
  }
  std::
  _Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<QString,_QString,_std::pmr::polymorphic_allocator<QString>,_std::__detail::_Identity,_std::equal_to<QString>,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_a8);
  std::pmr::monotonic_buffer_resource::~monotonic_buffer_resource(local_e8);
  if (&(local_728.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_728.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_728.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_728.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_728.d.d)->super_QArrayData,6,0x10);
    }
  }
LAB_00315211:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QLocale::uiLanguages(TagSeparator separator) const
{
    const char sep = char(separator);
    QStringList uiLanguages;
    if (uchar(sep) > 0x7f) {
        badSeparatorWarning("uiLanguages", sep);
        return uiLanguages;
    }
    QList<QLocaleId> localeIds;
#ifdef QT_NO_SYSTEMLOCALE
    constexpr bool isSystem = false;
#else
    const bool isSystem = d->m_data == &systemLocaleData;
    if (isSystem) {
        uiLanguages = systemLocale()->query(QSystemLocale::UILanguages).toStringList();
        if (separator != TagSeparator::Dash) {
            // Map from default separator, Dash, used by backends:
            const QChar join = QLatin1Char(sep);
            uiLanguages = uiLanguages.replaceInStrings(u"-", QStringView(&join, 1));
        }
        // ... but we need to include likely-adjusted forms of each of those, too.
        // For now, collect up locale Ids representing the entries, for later processing:
        for (const auto &entry : std::as_const(uiLanguages))
            localeIds.append(QLocaleId::fromName(entry));
        if (localeIds.isEmpty())
            localeIds.append(systemLocale()->fallbackLocale().d->m_data->id());
        // If the system locale (isn't C and) didn't include itself in the list,
        // or as fallback, presume to know better than it and put its name
        // first. (Known issue, QTBUG-104930, on some macOS versions when in
        // locale en_DE.) Our translation system might have a translation for a
        // locale the platform doesn't believe in.
        const QString name = QString::fromLatin1(d->m_data->id().name(sep)); // Raw name
        if (!name.isEmpty() && language() != C && !uiLanguages.contains(name)) {
            // That uses contains(name) as a cheap pre-test, but there may be an
            // entry that matches this on purging likely subtags.
            const QLocaleId id = d->m_data->id();
            const QLocaleId mine = id.withLikelySubtagsRemoved();
            const auto isMine = [mine](const QString &entry) {
                return QLocaleId::fromName(entry).withLikelySubtagsRemoved() == mine;
            };
            if (std::none_of(uiLanguages.constBegin(), uiLanguages.constEnd(), isMine)) {
                localeIds.prepend(id);
                uiLanguages.prepend(QString::fromLatin1(id.name(sep)));
            }
        }
    } else
#endif
    {
        localeIds.append(d->m_data->id());
    }

    for (qsizetype i = localeIds.size(); i-- > 0; ) {
        const QLocaleId id = localeIds.at(i);
        Q_ASSERT(id.language_id);
        if (id.language_id == C) {
            if (!uiLanguages.contains(u"C"_s))
                uiLanguages.append(u"C"_s);
            // Attempt no likely sub-tag amendments to C.
            continue;
        }

        qsizetype j;
        const QByteArray prior = id.name(sep);
        bool faithful = true; // prior matches uiLanguages.at(j - 1)
        if (isSystem && i < uiLanguages.size()) {
            // Adding likely-adjusted forms to system locale's list.
            faithful = uiLanguages.at(i) == QLatin1StringView(prior);
            Q_ASSERT(faithful
                     // A legacy code may get mapped to an ID with a different name:
                     || QLocaleId::fromName(uiLanguages.at(i)).name(sep) == prior);
            // Insert just after the entry we're supplementing:
            j = i + 1;
        } else {
            // Plain locale or empty system uiLanguages; just append.
            if (!uiLanguages.contains(QLatin1StringView(prior)))
                uiLanguages.append(QString::fromLatin1(prior));
            j = uiLanguages.size();
        }

        const QLocaleId max = id.withLikelySubtagsAdded();
        Q_ASSERT(max.language_id);
        Q_ASSERT(max.language_id == id.language_id);
        // We can't say the same for script or territory, though.

        // We have various candidates to consider.
        const auto addIfEquivalent = [&j, &uiLanguages, max, sep, prior, faithful](QLocaleId cid) {
            if (cid.withLikelySubtagsAdded() == max) {
                if (const QByteArray name = cid.name(sep); name != prior)
                    uiLanguages.insert(j, QString::fromLatin1(name));
                else if (faithful) // Later candidates are more specific, so go before.
                    --j;
            }
        };
        // language
        addIfEquivalent({ max.language_id, 0, 0 });
        // language-script
        if (max.script_id)
            addIfEquivalent({ max.language_id, max.script_id, 0 });
        if (id.script_id && id.script_id != max.script_id)
            addIfEquivalent({ id.language_id, id.script_id, 0 });
        // language-territory
        if (max.territory_id)
            addIfEquivalent({ max.language_id, 0, max.territory_id });
        if (id.territory_id && id.territory_id != max.territory_id)
            addIfEquivalent({ id.language_id, 0, id.territory_id });
        // full
        if (max.territory_id && max.script_id)
            addIfEquivalent(max);
        if (max.territory_id && id.script_id && id.script_id != max.script_id)
            addIfEquivalent({ id.language_id, id.script_id, max.territory_id });
        if (max.script_id && id.territory_id && id.territory_id != max.territory_id)
            addIfEquivalent({ id.language_id, max.script_id, id.territory_id });
        if (id.territory_id && id.territory_id != max.territory_id
            && id.script_id && id.script_id != max.script_id) {
            addIfEquivalent(id);
        }
    }

    // Second pass: deduplicate.
    QDuplicateTracker<QString> known(uiLanguages.size());
    for (qsizetype i = 0; i < uiLanguages.size();) {
        if (known.hasSeen(uiLanguages.at(i)))
            uiLanguages.remove(i);
        else
            ++i;
    }

    // Third pass: add truncations, when not already present.
    // Cubic in list length, but hopefully that's at most a dozen or so.
    const QLatin1Char cut(sep);
    const auto hasPrefix = [cut](auto name, QStringView stem) {
        // A prefix only counts if it's either full or followed by a separator.
        return name.startsWith(stem)
            && (name.size() == stem.size() || name.at(stem.size()) == cut);
    };
    // As we now forward-traverse the list, we need to keep track of the
    // positions just after (a) the block of things added above that are
    // equivalent to the current entry and (b) the block of truncations (if any)
    // added just after this block. All truncations of entries in (a) belong at
    // the end of (b); once i advances to the end of (a) it must jump to just
    // after (b). The more specific entries in (a) may well have truncations
    // that can also arise from less specific ones later in (a); for the
    // purposes of determining whether such truncations go at the end of (b) or
    // the end of the list, we thus need to ignore these matches.
    qsizetype afterEquivs = 0;
    qsizetype afterTruncs = 0;
    // From here onwards, we only have the truncations we're adding, whose
    // truncations should all have been included already.
    // If advancing i brings us to the end of block (a), jump to the end of (b):
    for (qsizetype i = 0; i < uiLanguages.size(); ++i >= afterEquivs && (i = afterTruncs)) {
        const QString entry = uiLanguages.at(i);
        const QLocaleId max = QLocaleId::fromName(entry).withLikelySubtagsAdded();
        // Keep track of our two blocks:
        if (i >= afterEquivs) {
            Q_ASSERT(i >= afterTruncs); // i.e. we just skipped past the end of a block
            afterEquivs = i + 1;
            // Advance past equivalents of entry:
            while (afterEquivs < uiLanguages.size()
                   && QLocaleId::fromName(uiLanguages.at(afterEquivs))
                           .withLikelySubtagsAdded() == max) {
                ++afterEquivs;
            }
            // We'll add any truncations starting there:
            afterTruncs = afterEquivs;
        }
        if (hasPrefix(entry, u"C") || hasPrefix(entry, u"und"))
            continue;
        qsizetype stopAt = uiLanguages.size();
        QString prefix = entry;
        qsizetype at = 0;
        while ((at = prefix.lastIndexOf(cut)) > 0) {
            prefix = prefix.first(at);
            // Don't test with hasSeen() as we might defer adding to later, when
            // we'll need known to see the later entry's offering of this prefix
            // as a new entry.
            bool found = known.contains(prefix);
            /* By default we append but if no later entry has this as a prefix
               and the locale it implies would use the same script as entry, put
               it after the block of consecutive equivalents of which entry is a
               part instead. Thus [en-NL, nl-NL, en-GB] will append en but
               [en-NL, en-GB, nl-NL] will put it before nl-NL, for example. We
               require a script match so we don't pick translations that the
               user cannot read, despite knowing the language. (Ideally that
               would be a constraint the caller can opt into / out of. See
               QTBUG-112765.)
            */
            bool justAfter
                = (QLocaleId::fromName(prefix).withLikelySubtagsAdded().script_id == max.script_id);
            for (qsizetype j = afterTruncs; !found && j < stopAt; ++j) {
                QString later = uiLanguages.at(j);
                if (!later.startsWith(prefix)) {
                    const QByteArray laterFull =
                        QLocaleId::fromName(later.replace(cut, u'-')
                            ).withLikelySubtagsAdded().name(sep);
                    // When prefix matches a later entry's max, it belongs later.
                    if (hasPrefix(QLatin1StringView(laterFull), prefix))
                        justAfter = false;
                    continue;
                }
                // The duplicate tracker would already have spotted if equal:
                Q_ASSERT(later.size() > prefix.size());
                if (later.at(prefix.size()) == cut) {
                    justAfter = false;
                    // Prefix match. Shall produce the same prefix, but possibly
                    // after prefixes of other entries in the list. If later has
                    // a longer prefix not yet in the list, we want that before
                    // this shorter prefix, so leave this for later, otherwise,
                    // we include this prefix right away.
                    QStringView head{later};
                    for (qsizetype as = head.lastIndexOf(cut);
                         !found && as > prefix.size(); as = head.lastIndexOf(cut)) {
                        head = head.first(as);
                        bool seen = false;
                        for (qsizetype k = j + 1; !seen && k < uiLanguages.size(); ++k)
                            seen = uiLanguages.at(k) == head;
                        if (!seen)
                            found = true;
                    }
                }
            }
            if (found) // Don't duplicate.
                break; // any further truncations of prefix would also be found.
            // Now we're committed to adding it, get it into known:
            (void) known.hasSeen(prefix);
            if (justAfter) {
                uiLanguages.insert(afterTruncs++, prefix);
                ++stopAt; // All later entries have moved one step later.
            } else {
                uiLanguages.append(prefix);
            }
        }
    }

    return uiLanguages;
}